

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Revision.cpp
# Opt level: O0

string * __thiscall OpenMD::Revision::getVersion_abi_cxx11_(Revision *this)

{
  string *in_RDI;
  string *v;
  
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::assign((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  return in_RDI;
}

Assistant:

std::string Revision::getVersion() {
    std::string v;
    v.assign("Version: ");
    v.append(version);
    return v;
  }